

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeLdLen
          (GlobOpt *this,Instr **instrRef,Value **src1ValueRef,Value **dstValueRef,
          bool *forceInvariantHoistingRef)

{
  undefined2 baseValueType;
  ArrayRegOpnd *this_00;
  ValueInfo *this_01;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  StackSym *sym;
  RegOpnd *newSrc;
  Value *pVVar8;
  IntConstantBounds local_50;
  IntConstantBounds lengthConstantBounds;
  
  lengthConstantBounds = (IntConstantBounds)src1ValueRef;
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b3,"(instrRef)","instrRef");
    if (!bVar2) goto LAB_0045d943;
    *puVar6 = 0;
  }
  pIVar7 = *instrRef;
  if (pIVar7 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b5,"(instr)","instr");
    if (!bVar2) goto LAB_0045d943;
    *puVar6 = 0;
    pIVar7 = *instrRef;
  }
  if (pIVar7->m_opcode != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b6,"(instr->m_opcode == Js::OpCode::LdLen_A)",
                       "instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar2) goto LAB_0045d943;
    *puVar6 = 0;
  }
  if (lengthConstantBounds == (IntConstantBounds)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b7,"(src1ValueRef)","src1ValueRef");
    if (!bVar2) goto LAB_0045d943;
    *puVar6 = 0;
  }
  if (dstValueRef == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b9,"(dstValueRef)","dstValueRef");
    if (!bVar2) goto LAB_0045d943;
    *puVar6 = 0;
  }
  if (forceInvariantHoistingRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29bb,"(forceInvariantHoistingRef)","forceInvariantHoistingRef");
    if (!bVar2) goto LAB_0045d943;
    *puVar6 = 0;
  }
  baseValueType = (*instrRef)->m_src1->m_valueType;
  bVar2 = DoLdLenIntSpec(this,*instrRef,(ValueType)baseValueType);
  if (bVar2) {
    BVar5 = BailOutOnIrregularLength;
    if (this->prePassLoop == (Loop *)0x0) {
      this_00 = (ArrayRegOpnd *)(*instrRef)->m_src1;
      OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_0045d943;
        *puVar6 = 0;
      }
      bVar4 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
      if (bVar4) {
        bVar4 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
          if (!bVar4) goto LAB_0045d943;
          *puVar6 = 0;
        }
        sym = IR::ArrayRegOpnd::LengthSym(this_00);
        if (sym != (StackSym *)0x0) {
          CaptureByteCodeSymUses(this,*instrRef);
          pIVar7 = *instrRef;
          pIVar7->m_opcode = Ld_I4;
          newSrc = IR::RegOpnd::New(sym,sym->m_type,this->func);
          IR::Instr::ReplaceSrc1(pIVar7,&newSrc->super_Opnd);
          IR::Instr::ClearBailOutInfo(*instrRef);
          pVVar8 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&sym->super_Sym);
          if (pVVar8 == (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d3,"(lengthValue)","lengthValue");
            if (!bVar4) goto LAB_0045d943;
            *puVar6 = 0;
          }
          *(Value **)lengthConstantBounds = pVVar8;
          this_01 = pVVar8->valueInfo;
          local_50.lowerBound = 0;
          local_50.upperBound = 0;
          bVar4 = ValueInfo::TryGetIntConstantBounds(this_01,&local_50,false);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d7,
                               "(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds))",
                               "lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds)");
            if (!bVar4) goto LAB_0045d943;
            *puVar6 = 0;
          }
          if (-1 < local_50.lowerBound) {
LAB_0045d85a:
            if ((StackSym *)this_01->symStore == sym) {
              this_01->symStore = (Sym *)0x0;
            }
            TypeSpecializeIntDst
                      (this,*instrRef,LdLen_A,*(Value **)lengthConstantBounds,
                       *(Value **)lengthConstantBounds,(Value *)0x0,BailOutOnIrregularLength,
                       local_50.lowerBound,local_50.upperBound,dstValueRef,(AddSubConstantInfo *)0x0
                      );
            *forceInvariantHoistingRef = true;
            return bVar2;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x29d8,"(lengthConstantBounds.LowerBound() >= 0)",
                             "lengthConstantBounds.LowerBound() >= 0");
          if (bVar4) {
            *puVar6 = 0;
            goto LAB_0045d85a;
          }
          goto LAB_0045d943;
        }
      }
      if (((*instrRef)->field_0x38 & 0x10) == 0) {
        BVar5 = BailOutOnIrregularLength;
        GenerateBailAtOperation(this,instrRef,BailOutOnIrregularLength);
      }
      else {
        BVar5 = IR::Instr::GetBailOutKind(*instrRef);
        if (BVar5 != BailOutMarkTempObject) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x29f6,"(instr->GetBailOutKind() == IR::BailOutMarkTempObject)",
                             "instr->GetBailOutKind() == IR::BailOutMarkTempObject");
          if (!bVar4) {
LAB_0045d943:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        BVar5 = BailOutMarkTempObject|BailOutOnIrregularLength;
        IR::Instr::SetBailOutKind(*instrRef,BailOutMarkTempObject|BailOutOnIrregularLength);
      }
    }
    TypeSpecializeIntDst
              (this,*instrRef,LdLen_A,(Value *)0x0,(Value *)0x0,(Value *)0x0,BVar5,0,0x7fffffff,
               dstValueRef,(AddSubConstantInfo *)0x0);
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::TypeSpecializeLdLen(
    IR::Instr * *const instrRef,
    Value * *const src1ValueRef,
    Value * *const dstValueRef,
    bool *const forceInvariantHoistingRef)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdLen_A);
    Assert(src1ValueRef);
    Value *&src1Value = *src1ValueRef;
    Assert(dstValueRef);
    Value *&dstValue = *dstValueRef;
    Assert(forceInvariantHoistingRef);
    bool &forceInvariantHoisting = *forceInvariantHoistingRef;

    if(!DoLdLenIntSpec(instr, instr->GetSrc1()->GetValueType()))
    {
        return false;
    }

    IR::BailOutKind bailOutKind = IR::BailOutOnIrregularLength;
    if(!IsLoopPrePass())
    {
        IR::RegOpnd *const baseOpnd = instr->GetSrc1()->AsRegOpnd();
        if(baseOpnd->IsArrayRegOpnd())
        {
            StackSym *const lengthSym = baseOpnd->AsArrayRegOpnd()->LengthSym();
            if(lengthSym)
            {
                CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Ld_I4;
                instr->ReplaceSrc1(IR::RegOpnd::New(lengthSym, lengthSym->GetType(), func));
                instr->ClearBailOutInfo();

                // Find the hoisted length value
                Value *const lengthValue = CurrentBlockData()->FindValue(lengthSym);
                Assert(lengthValue);
                src1Value = lengthValue;
                ValueInfo *const lengthValueInfo = lengthValue->GetValueInfo();
                IntConstantBounds lengthConstantBounds;
                AssertVerify(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds));
                Assert(lengthConstantBounds.LowerBound() >= 0);

                if (lengthValueInfo->GetSymStore() == lengthSym)
                {
                    // When type specializing the dst below, we will end up inserting lengthSym.u32 as symstore for a var
                    // Clear the symstore here, so that we dont end up with problems with copyprop later on
                    lengthValueInfo->SetSymStore(nullptr);
                }

                // Int-specialize, and transfer the value to the dst
                TypeSpecializeIntDst(
                    instr,
                    Js::OpCode::LdLen_A,
                    src1Value,
                    src1Value,
                    nullptr,
                    bailOutKind,
                    lengthConstantBounds.LowerBound(),
                    lengthConstantBounds.UpperBound(),
                    &dstValue);

                // Try to force hoisting the Ld_I4 so that the length will have an invariant sym store that can be
                // copy-propped. Invariant hoisting does not automatically hoist Ld_I4.
                forceInvariantHoisting = true;
                return true;
            }
        }

        if (instr->HasBailOutInfo())
        {
            Assert(instr->GetBailOutKind() == IR::BailOutMarkTempObject);
            bailOutKind = IR::BailOutOnIrregularLength | IR::BailOutMarkTempObject;
            instr->SetBailOutKind(bailOutKind);
        }
        else
        {
            Assert(bailOutKind == IR::BailOutOnIrregularLength);
            GenerateBailAtOperation(&instr, bailOutKind);
        }
    }

    TypeSpecializeIntDst(
        instr,
        Js::OpCode::LdLen_A,
        nullptr,
        nullptr,
        nullptr,
        bailOutKind,
        0,
        INT32_MAX,
        &dstValue);
    return true;
}